

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<Assimp::FIBase64Value>
Assimp::FIBase64Value::create(vector<unsigned_char,_std::allocator<unsigned_char>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIBase64Value> sVar2;
  pointer local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<Assimp::FIBase64ValueImpl,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = local_18;
  (value->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)_Var1._M_pi;
  local_18 = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)value;
  return (shared_ptr<Assimp::FIBase64Value>)
         sVar2.super___shared_ptr<Assimp::FIBase64Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIBase64Value> FIBase64Value::create(std::vector<uint8_t> &&value) {
    return std::make_shared<FIBase64ValueImpl>(std::move(value));
}